

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.h
# Opt level: O0

char __thiscall Bstrlib::CBCharWriteProtected::operator=(CBCharWriteProtected *this,char c)

{
  char c_local;
  CBCharWriteProtected *this_local;
  
  if (0 < this->s->mlen) {
    if ((uint)this->s->slen <= this->idx) {
      return '\0';
    }
    this->s->data[this->idx] = c;
  }
  return this->s->data[this->idx];
}

Assistant:

inline char operator = (char c) {
		if (s.mlen <= 0) {
			bstringThrow ("Write protection error");
		} else {
#ifndef BSTRLIB_THROWS_EXCEPTIONS
			if (idx >= (unsigned) s.slen) return '\0';
#endif
			s.data[idx] = (unsigned char) c;
		}
		return (char) s.data[idx];
	}